

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int alloc_addbyter(int output,FILE *data)

{
  void *pvVar1;
  char *pcVar2;
  
  pvVar1 = *(void **)data;
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (*Curl_cmalloc)(0x20);
    *(void **)data = pvVar1;
    if (pvVar1 == (void *)0x0) {
LAB_001034f9:
      *(undefined4 *)&data->_IO_read_base = 1;
      return -1;
    }
    data->_IO_read_end = (char *)0x20;
    data->_IO_read_ptr = (char *)0x0;
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = data->_IO_read_ptr;
    if (data->_IO_read_end <= pcVar2 + 1) {
      pvVar1 = (*Curl_crealloc)(pvVar1,(long)data->_IO_read_end * 2);
      if (pvVar1 == (void *)0x0) goto LAB_001034f9;
      *(void **)data = pvVar1;
      data->_IO_read_end = (char *)((long)data->_IO_read_end << 1);
      pcVar2 = data->_IO_read_ptr;
    }
  }
  pcVar2[(long)pvVar1] = (char)output;
  data->_IO_read_ptr = data->_IO_read_ptr + 1;
  return output & 0xff;
}

Assistant:

static int alloc_addbyter(int output, FILE *data)
{
  struct asprintf *infop=(struct asprintf *)data;
  unsigned char outc = (unsigned char)output;

  if(!infop->buffer) {
    infop->buffer = malloc(32);
    if(!infop->buffer) {
      infop->fail = 1;
      return -1; /* fail */
    }
    infop->alloc = 32;
    infop->len =0;
  }
  else if(infop->len+1 >= infop->alloc) {
    char *newptr;

    newptr = realloc(infop->buffer, infop->alloc*2);

    if(!newptr) {
      infop->fail = 1;
      return -1; /* fail */
    }
    infop->buffer = newptr;
    infop->alloc *= 2;
  }

  infop->buffer[ infop->len ] = outc;

  infop->len++;

  return outc; /* fputc() returns like this on success */
}